

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O1

Aig_Man_t * Saig_ManCreateIndMiter(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  void *__ptr;
  Aig_Man_t *p;
  size_t sVar4;
  char *pcVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  Aig_Obj_t *p1;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  
  sVar4 = (long)pAig->vObjs->nSize * 2;
  __ptr = calloc(sVar4,8);
  p = Aig_ManStart((int)sVar4);
  pcVar2 = pAig->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p->pName = pcVar5;
  pcVar2 = pAig->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar2);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar2);
  }
  p->pSpec = pcVar5;
  pAVar6 = p->pConst1;
  iVar9 = pAig->pConst1->Id;
  lVar8 = 0;
  do {
    *(Aig_Obj_t **)((long)__ptr + lVar8 * 8 + (long)iVar9 * 0x10) = pAVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 == 1);
  iVar9 = 0;
  do {
    if (pAig->nRegs < pAig->nObjs[2]) {
      lVar8 = 0;
      do {
        if (pAig->vCis->nSize <= lVar8) goto LAB_006d2de4;
        pvVar3 = pAig->vCis->pArray[lVar8];
        pAVar6 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)__ptr + ((long)iVar9 + (long)*(int *)((long)pvVar3 + 0x24) * 2) * 8) =
             pAVar6;
        lVar8 = lVar8 + 1;
      } while (lVar8 < (long)pAig->nObjs[2] - (long)pAig->nRegs);
    }
    bVar16 = iVar9 == 0;
    iVar9 = iVar9 + 1;
  } while (bVar16);
  uVar10 = pAig->nObjs[2] - pAig->nRegs;
  pVVar7 = pAig->vCis;
  if ((int)uVar10 < pVVar7->nSize) {
    uVar15 = (ulong)uVar10;
    do {
      if ((int)uVar10 < 0) {
LAB_006d2de4:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pVVar7->pArray[uVar15];
      pAVar6 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar3 + 0x24) * 0x10) = pAVar6;
      uVar15 = uVar15 + 1;
      pVVar7 = pAig->vCis;
    } while ((int)uVar15 < pVVar7->nSize);
  }
  iVar9 = 0;
  do {
    pVVar7 = pAig->vObjs;
    lVar8 = (long)iVar9;
    if (0 < pVVar7->nSize) {
      lVar11 = 0;
      do {
        pvVar3 = pVVar7->pArray[lVar11];
        if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
          uVar15 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            pAVar6 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar6 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar3 + 8) & 1) ^
                     *(ulong *)((long)__ptr + ((long)*(int *)(uVar15 + 0x24) * 2 + lVar8) * 8));
          }
          uVar15 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (uVar15 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1) ^
                 *(ulong *)((long)__ptr + ((long)*(int *)(uVar15 + 0x24) * 2 + lVar8) * 8));
          }
          pAVar6 = Aig_And(p,pAVar6,p1);
          *(Aig_Obj_t **)((long)__ptr + ((long)*(int *)((long)pvVar3 + 0x24) * 2 + lVar8) * 8) =
               pAVar6;
        }
        lVar11 = lVar11 + 1;
        pVVar7 = pAig->vObjs;
      } while (lVar11 < pVVar7->nSize);
    }
    iVar12 = pAig->nRegs;
    lVar11 = (long)iVar12;
    if (0 < lVar11) {
      pVVar7 = pAig->vCos;
      iVar1 = pAig->nObjs[3];
      uVar15 = (ulong)(uint)(iVar1 - iVar12);
      iVar12 = -iVar12;
      do {
        if (((((int)uVar15 < 0) || (pVVar7->nSize <= iVar1 + iVar12)) ||
            (uVar10 = pAig->nObjs[2] + iVar12, (int)uVar10 < 0)) ||
           (pAig->vCis->nSize <= (int)uVar10)) goto LAB_006d2de4;
        uVar13 = *(ulong *)((long)pVVar7->pArray[uVar15] + 8);
        uVar14 = uVar13 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = (ulong)((uint)uVar13 & 1) ^
                   *(ulong *)((long)__ptr + ((long)*(int *)(uVar14 + 0x24) * 2 + lVar8) * 8);
        }
        if (iVar9 == 0) {
          *(ulong *)((long)__ptr +
                    (long)*(int *)((long)pAig->vCis->pArray[uVar10] + 0x24) * 0x10 + 8) = uVar13;
        }
        uVar15 = uVar15 + 1;
        iVar12 = iVar12 + 1;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    bVar16 = iVar9 != 0;
    iVar9 = iVar9 + 1;
    if (bVar16) {
      if (0 < vCands->nSize) {
        lVar8 = 0;
        do {
          pvVar3 = vCands->pArray[lVar8];
          if (0 < *(int *)((long)pvVar3 + 4)) {
            lVar11 = 0;
            do {
              uVar15 = *(ulong *)(*(long *)((long)pvVar3 + 8) + lVar11 * 8);
              iVar9 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24);
              uVar15 = (ulong)((uint)uVar15 & 1);
              pAVar6 = Aig_And(p,(Aig_Obj_t *)
                                 (*(ulong *)((long)__ptr + (long)iVar9 * 0x10) ^ uVar15),
                               (Aig_Obj_t *)
                               (uVar15 ^ *(ulong *)((long)__ptr + (long)(iVar9 * 2 + 1) * 8) ^ 1));
              Aig_ObjCreateCo(p,pAVar6);
              lVar11 = lVar11 + 1;
            } while (lVar11 < *(int *)((long)pvVar3 + 4));
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vCands->nSize);
      }
      Aig_ManCleanup(p);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return p;
    }
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
    int nFrames = 2;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }

    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
            Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
            Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
            Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
            Aig_ObjCreateCo( pFrames, pMiter );
        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}